

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disci_intersector.h
# Opt level: O1

bool embree::avx512::DiscMiIntersector1<8,_true>::occluded
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *Disc)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined1 auVar5 [16];
  Geometry *pGVar6;
  long lVar7;
  __int_type_conflict _Var8;
  RTCFilterFunctionN p_Var9;
  undefined1 auVar10 [32];
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  ulong uVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  ulong uVar23;
  Scene *pSVar24;
  ulong uVar25;
  byte bVar26;
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  float fVar36;
  float fVar38;
  float fVar39;
  float fVar40;
  undefined1 auVar37 [32];
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  undefined1 auVar48 [32];
  undefined4 uVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [32];
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  int local_1c0;
  float local_1bc;
  RayQueryContext *local_1b8;
  undefined4 local_1b0;
  undefined4 local_1ac;
  undefined4 local_1a8;
  undefined4 local_1a4;
  undefined4 local_1a0;
  undefined4 local_19c;
  uint local_198;
  uint local_194;
  uint local_190;
  Scene *local_178;
  RTCFilterFunctionNArguments local_170;
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  float local_c0 [4];
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  float fStack_a4;
  float local_a0 [4];
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  float local_80 [4];
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  
  pSVar24 = context->scene;
  pGVar6 = (pSVar24->geometries).items[Disc->sharedGeomID].ptr;
  lVar7 = *(long *)&pGVar6->field_0x58;
  _Var8 = pGVar6[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar31._16_16_ = *(undefined1 (*) [16])(lVar7 + (Disc->primIDs).field_0.i[4] * _Var8);
  auVar31._0_16_ = *(undefined1 (*) [16])(lVar7 + (Disc->primIDs).field_0.i[0] * _Var8);
  auVar33._16_16_ = *(undefined1 (*) [16])(lVar7 + (Disc->primIDs).field_0.i[5] * _Var8);
  auVar33._0_16_ = *(undefined1 (*) [16])(lVar7 + (Disc->primIDs).field_0.i[1] * _Var8);
  auVar35._16_16_ = *(undefined1 (*) [16])(lVar7 + (Disc->primIDs).field_0.i[6] * _Var8);
  auVar35._0_16_ = *(undefined1 (*) [16])(lVar7 + (Disc->primIDs).field_0.i[2] * _Var8);
  auVar37._16_16_ = *(undefined1 (*) [16])(lVar7 + (Disc->primIDs).field_0.i[7] * _Var8);
  auVar37._0_16_ = *(undefined1 (*) [16])(lVar7 + (Disc->primIDs).field_0.i[3] * _Var8);
  auVar27 = vunpcklps_avx(auVar31,auVar35);
  auVar31 = vunpckhps_avx(auVar31,auVar35);
  auVar29 = vunpcklps_avx(auVar33,auVar37);
  auVar33 = vunpckhps_avx(auVar33,auVar37);
  auVar30 = vunpcklps_avx(auVar27,auVar29);
  auVar29 = vunpckhps_avx(auVar27,auVar29);
  auVar10 = vunpcklps_avx(auVar31,auVar33);
  local_140 = vpbroadcastd_avx512vl();
  auVar27._0_16_ = *(undefined1 (*) [16])&ray->dir;
  auVar27._16_4_ = ray->tfar;
  auVar27._20_4_ = ray->mask;
  auVar27._24_4_ = ray->id;
  auVar27._28_4_ = ray->flags;
  fVar1 = *(float *)&(ray->dir).field_0;
  auVar32._4_4_ = fVar1;
  auVar32._0_4_ = fVar1;
  auVar32._8_4_ = fVar1;
  auVar32._12_4_ = fVar1;
  auVar32._16_4_ = fVar1;
  auVar32._20_4_ = fVar1;
  auVar32._24_4_ = fVar1;
  auVar32._28_4_ = fVar1;
  auVar5 = *(undefined1 (*) [16])((long)&(ray->dir).field_0 + 4);
  fVar2 = *(float *)((long)&(ray->dir).field_0 + 4);
  auVar34._4_4_ = fVar2;
  auVar34._0_4_ = fVar2;
  auVar34._8_4_ = fVar2;
  auVar34._12_4_ = fVar2;
  auVar34._16_4_ = fVar2;
  auVar34._20_4_ = fVar2;
  auVar34._24_4_ = fVar2;
  auVar34._28_4_ = fVar2;
  fVar4 = (ray->dir).field_0.m128[2];
  fVar36 = (ray->dir).field_0.m128[3];
  fVar3 = (ray->dir).field_0.m128[2];
  auVar50._0_4_ = fVar4 * fVar4;
  auVar50._4_4_ = fVar36 * fVar36;
  auVar50._8_4_ = ray->tfar * ray->tfar;
  auVar50._12_4_ = (float)ray->mask * (float)ray->mask;
  auVar5 = vfmadd231ps_fma(auVar50,auVar5,auVar5);
  auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar27,auVar27);
  uVar49 = auVar5._0_4_;
  auVar48._4_4_ = uVar49;
  auVar48._0_4_ = uVar49;
  auVar48._8_4_ = uVar49;
  auVar48._12_4_ = uVar49;
  auVar48._16_4_ = uVar49;
  auVar48._20_4_ = uVar49;
  auVar48._24_4_ = uVar49;
  auVar48._28_4_ = uVar49;
  auVar27 = vrcp14ps_avx512vl(auVar48);
  auVar28._8_4_ = 0x3f800000;
  auVar28._0_8_ = &DAT_3f8000003f800000;
  auVar28._12_4_ = 0x3f800000;
  auVar28._16_4_ = 0x3f800000;
  auVar28._20_4_ = 0x3f800000;
  auVar28._24_4_ = 0x3f800000;
  auVar28._28_4_ = 0x3f800000;
  auVar28 = vfnmadd213ps_avx512vl(auVar48,auVar27,auVar28);
  auVar5 = vfmadd132ps_fma(auVar28,auVar27,auVar27);
  uVar49 = *(undefined4 *)&(ray->org).field_0;
  auVar15._4_4_ = uVar49;
  auVar15._0_4_ = uVar49;
  auVar15._8_4_ = uVar49;
  auVar15._12_4_ = uVar49;
  auVar15._16_4_ = uVar49;
  auVar15._20_4_ = uVar49;
  auVar15._24_4_ = uVar49;
  auVar15._28_4_ = uVar49;
  auVar27 = vsubps_avx512vl(auVar30,auVar15);
  uVar49 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
  auVar16._4_4_ = uVar49;
  auVar16._0_4_ = uVar49;
  auVar16._8_4_ = uVar49;
  auVar16._12_4_ = uVar49;
  auVar16._16_4_ = uVar49;
  auVar16._20_4_ = uVar49;
  auVar16._24_4_ = uVar49;
  auVar16._28_4_ = uVar49;
  auVar28 = vsubps_avx512vl(auVar29,auVar16);
  uVar49 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
  auVar29._4_4_ = uVar49;
  auVar29._0_4_ = uVar49;
  auVar29._8_4_ = uVar49;
  auVar29._12_4_ = uVar49;
  auVar29._16_4_ = uVar49;
  auVar29._20_4_ = uVar49;
  auVar29._24_4_ = uVar49;
  auVar29._28_4_ = uVar49;
  auVar29 = vsubps_avx512vl(auVar10,auVar29);
  fVar41 = auVar29._0_4_;
  fVar42 = auVar29._4_4_;
  auVar17._4_4_ = fVar42 * fVar3;
  auVar17._0_4_ = fVar41 * fVar3;
  fVar43 = auVar29._8_4_;
  auVar17._8_4_ = fVar43 * fVar3;
  fVar44 = auVar29._12_4_;
  auVar17._12_4_ = fVar44 * fVar3;
  fVar45 = auVar29._16_4_;
  auVar17._16_4_ = fVar45 * fVar3;
  fVar46 = auVar29._20_4_;
  auVar17._20_4_ = fVar46 * fVar3;
  fVar47 = auVar29._24_4_;
  auVar17._24_4_ = fVar47 * fVar3;
  auVar17._28_4_ = auVar30._28_4_;
  auVar50 = vfmadd231ps_fma(auVar17,auVar28,auVar34);
  auVar50 = vfmadd231ps_fma(ZEXT1632(auVar50),auVar27,auVar32);
  fVar36 = auVar5._0_4_ * auVar50._0_4_;
  fVar38 = auVar5._4_4_ * auVar50._4_4_;
  fVar39 = auVar5._8_4_ * auVar50._8_4_;
  fVar40 = auVar5._12_4_ * auVar50._12_4_;
  local_e0 = ZEXT1632(CONCAT412(fVar40,CONCAT48(fVar39,CONCAT44(fVar38,fVar36))));
  fVar4 = ray->tfar;
  auVar30._4_4_ = fVar4;
  auVar30._0_4_ = fVar4;
  auVar30._8_4_ = fVar4;
  auVar30._12_4_ = fVar4;
  auVar30._16_4_ = fVar4;
  auVar30._20_4_ = fVar4;
  auVar30._24_4_ = fVar4;
  auVar30._28_4_ = fVar4;
  uVar11 = vcmpps_avx512vl(local_e0,auVar30,2);
  auVar30 = vpbroadcastd_avx512vl();
  uVar49 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar10._4_4_ = uVar49;
  auVar10._0_4_ = uVar49;
  auVar10._8_4_ = uVar49;
  auVar10._12_4_ = uVar49;
  auVar10._16_4_ = uVar49;
  auVar10._20_4_ = uVar49;
  auVar10._24_4_ = uVar49;
  auVar10._28_4_ = uVar49;
  uVar12 = vcmpps_avx512vl(local_e0,auVar10,0xd);
  uVar13 = vpcmpgtd_avx512vl(auVar30,_DAT_0205a920);
  bVar26 = (byte)uVar11 & (byte)uVar12 & (byte)uVar13;
  if (bVar26 != 0) {
    auVar10 = vunpckhps_avx(auVar31,auVar33);
    auVar18._4_4_ = fVar1 * fVar38;
    auVar18._0_4_ = fVar1 * fVar36;
    auVar18._8_4_ = fVar1 * fVar39;
    auVar18._12_4_ = fVar1 * fVar40;
    auVar18._16_4_ = fVar1 * 0.0;
    auVar18._20_4_ = fVar1 * 0.0;
    auVar18._24_4_ = fVar1 * 0.0;
    auVar18._28_4_ = auVar33._28_4_;
    auVar19._4_4_ = fVar2 * fVar38;
    auVar19._0_4_ = fVar2 * fVar36;
    auVar19._8_4_ = fVar2 * fVar39;
    auVar19._12_4_ = fVar2 * fVar40;
    auVar19._16_4_ = fVar2 * 0.0;
    auVar19._20_4_ = fVar2 * 0.0;
    auVar19._24_4_ = fVar2 * 0.0;
    auVar19._28_4_ = auVar30._28_4_;
    auVar51._0_4_ = fVar3 * fVar36;
    auVar51._4_4_ = fVar3 * fVar38;
    auVar51._8_4_ = fVar3 * fVar39;
    auVar51._12_4_ = fVar3 * fVar40;
    auVar51._16_4_ = fVar3 * 0.0;
    auVar51._20_4_ = fVar3 * 0.0;
    auVar51._24_4_ = fVar3 * 0.0;
    auVar51._28_4_ = 0;
    auVar31 = vsubps_avx(auVar27,auVar18);
    auVar33 = vsubps_avx(auVar28,auVar19);
    auVar29 = vsubps_avx(auVar29,auVar51);
    auVar20._4_4_ = auVar29._4_4_ * auVar29._4_4_;
    auVar20._0_4_ = auVar29._0_4_ * auVar29._0_4_;
    auVar20._8_4_ = auVar29._8_4_ * auVar29._8_4_;
    auVar20._12_4_ = auVar29._12_4_ * auVar29._12_4_;
    auVar20._16_4_ = auVar29._16_4_ * auVar29._16_4_;
    auVar20._20_4_ = auVar29._20_4_ * auVar29._20_4_;
    auVar20._24_4_ = auVar29._24_4_ * auVar29._24_4_;
    auVar20._28_4_ = auVar29._28_4_;
    auVar5 = vfmadd231ps_fma(auVar20,auVar33,auVar33);
    auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar31,auVar31);
    auVar21._4_4_ = auVar10._4_4_ * auVar10._4_4_;
    auVar21._0_4_ = auVar10._0_4_ * auVar10._0_4_;
    auVar21._8_4_ = auVar10._8_4_ * auVar10._8_4_;
    auVar21._12_4_ = auVar10._12_4_ * auVar10._12_4_;
    auVar21._16_4_ = auVar10._16_4_ * auVar10._16_4_;
    auVar21._20_4_ = auVar10._20_4_ * auVar10._20_4_;
    auVar21._24_4_ = auVar10._24_4_ * auVar10._24_4_;
    auVar21._28_4_ = auVar10._28_4_;
    uVar11 = vcmpps_avx512vl(ZEXT1632(auVar5),auVar21,2);
    bVar26 = bVar26 & (byte)uVar11;
    if (bVar26 != 0) {
      auVar22._4_4_ = fVar42 * fVar42;
      auVar22._0_4_ = fVar41 * fVar41;
      auVar22._8_4_ = fVar43 * fVar43;
      auVar22._12_4_ = fVar44 * fVar44;
      auVar22._16_4_ = fVar45 * fVar45;
      auVar22._20_4_ = fVar46 * fVar46;
      auVar22._24_4_ = fVar47 * fVar47;
      auVar22._28_4_ = auVar31._28_4_;
      auVar5 = vfmadd213ps_fma(auVar28,auVar28,auVar22);
      auVar5 = vfmadd213ps_fma(auVar27,auVar27,ZEXT1632(auVar5));
      uVar11 = vcmpps_avx512vl(ZEXT1632(auVar5),auVar21,6);
      if ((bVar26 & (byte)uVar11) != 0) {
        local_100 = ZEXT832(0) << 0x20;
        local_120 = ZEXT832(0) << 0x20;
        local_c0[0] = -fVar1;
        local_c0[1] = -fVar1;
        local_c0[2] = -fVar1;
        local_c0[3] = -fVar1;
        fStack_b0 = -fVar1;
        fStack_ac = -fVar1;
        fStack_a8 = -fVar1;
        fStack_a4 = -fVar1;
        local_a0[0] = -fVar2;
        local_a0[1] = -fVar2;
        local_a0[2] = -fVar2;
        local_a0[3] = -fVar2;
        fStack_90 = -fVar2;
        fStack_8c = -fVar2;
        fStack_88 = -fVar2;
        fStack_84 = -fVar2;
        local_80[0] = -fVar3;
        local_80[1] = -fVar3;
        local_80[2] = -fVar3;
        local_80[3] = -fVar3;
        fStack_70 = -fVar3;
        fStack_6c = -fVar3;
        fStack_68 = -fVar3;
        fStack_64 = -fVar3;
        uVar25 = (ulong)(bVar26 & (byte)uVar11);
        local_1b8 = context;
        do {
          local_170.hit = (RTCHitN *)&local_1b0;
          uVar14 = 0;
          for (uVar23 = uVar25; (uVar23 & 1) == 0; uVar23 = uVar23 >> 1 | 0x8000000000000000) {
            uVar14 = uVar14 + 1;
          }
          local_198 = *(uint *)(local_140 + uVar14 * 4);
          pGVar6 = (pSVar24->geometries).items[local_198].ptr;
          if ((pGVar6->mask & ray->mask) == 0) {
LAB_01ce17c1:
            uVar25 = uVar25 ^ 1L << (uVar14 & 0x3f);
            bVar26 = 1;
          }
          else {
            if ((local_1b8->args->filter != (RTCFilterFunctionN)0x0) ||
               (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              uVar23 = (ulong)(uint)((int)uVar14 * 4);
              local_1a4 = *(undefined4 *)(local_120 + uVar23);
              local_1a0 = *(undefined4 *)(local_100 + uVar23);
              local_19c = *(undefined4 *)((long)&(Disc->primIDs).field_0 + uVar23);
              local_1b0 = *(undefined4 *)((long)local_c0 + uVar23);
              local_1ac = *(undefined4 *)((long)local_a0 + uVar23);
              local_1a8 = *(undefined4 *)((long)local_80 + uVar23);
              local_194 = local_1b8->user->instID[0];
              local_190 = local_1b8->user->instPrimID[0];
              local_1bc = ray->tfar;
              ray->tfar = *(float *)(local_e0 + uVar23);
              local_1c0 = -1;
              local_170.geometryUserPtr = pGVar6->userPtr;
              local_170.context = local_1b8->user;
              local_170.N = 1;
              local_170.valid = &local_1c0;
              local_170.ray = (RTCRayN *)ray;
              if ((pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0) &&
                 (local_178 = pSVar24, local_170.valid = &local_1c0,
                 (*pGVar6->occlusionFilterN)(&local_170), pSVar24 = local_178, *local_170.valid == 0
                 )) {
LAB_01ce1911:
                ray->tfar = local_1bc;
                goto LAB_01ce17c1;
              }
              p_Var9 = local_1b8->args->filter;
              if (p_Var9 != (RTCFilterFunctionN)0x0) {
                if (((local_1b8->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT) || (((pGVar6->field_8).field_0x2 & 0x40) != 0))
                {
                  (*p_Var9)(&local_170);
                }
                if (*local_170.valid == 0) goto LAB_01ce1911;
              }
            }
            bVar26 = 0;
          }
          if ((uVar25 != 0 & bVar26) == 0) {
            return (bool)(bVar26 ^ 1);
          }
        } while( true );
      }
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(const Precalculations& pre,
                                         Ray& ray,
                                         RayQueryContext* context,
                                         const Primitive& Disc)
      {
        STAT3(shadow.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(Disc.geomID());
        Vec4vf<M> v0; Disc.gather(v0, geom);
        const vbool<M> valid = Disc.valid();
        return DiscIntersector1<M>::intersect(
          valid, ray, context, geom, pre, v0, Occluded1EpilogM<M, filter>(ray, context, Disc.geomID(), Disc.primID()));
      }